

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O0

void __thiscall btHingeConstraint::buildJacobian(btHingeConstraint *this)

{
  btTransform *pbVar1;
  btTransform *pbVar2;
  btTransform *pbVar3;
  btMatrix3x3 *pbVar4;
  btRigidBody *pbVar5;
  btVector3 *inertiaInvA;
  btHingeConstraint *in_RDI;
  btScalar bVar6;
  btScalar bVar7;
  btVector3 bVar8;
  btVector3 axisA;
  btVector3 hingeAxisWorld;
  btVector3 jointAxis1;
  btVector3 jointAxis0;
  btVector3 jointAxis1local;
  btVector3 jointAxis0local;
  int i;
  btVector3 normal [3];
  btVector3 relPos;
  btVector3 pivotBInW;
  btVector3 pivotAInW;
  btVector3 *in_stack_fffffffffffffc38;
  btTransform *in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  btVector3 *in_stack_fffffffffffffc50;
  btHingeConstraint *this_00;
  btVector3 *in_stack_fffffffffffffc90;
  btVector3 *in_stack_fffffffffffffc98;
  btMatrix3x3 *in_stack_fffffffffffffca0;
  btVector3 *in_stack_fffffffffffffcb8;
  btVector3 *pbVar9;
  btVector3 *in_stack_fffffffffffffcc0;
  btMatrix3x3 *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 uVar10;
  btJacobianEntry *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  btJacobianEntry *rel_pos2;
  undefined4 in_stack_fffffffffffffd10;
  btVector3 *local_2c8;
  btVector3 local_298 [18];
  btScalar local_178 [4];
  btScalar local_168 [4];
  btScalar local_158 [4];
  btScalar local_148 [4];
  btScalar local_138 [4];
  btVector3 local_128;
  undefined1 local_118 [32];
  btScalar local_f8 [4];
  btScalar local_88;
  btScalar local_84;
  btScalar local_80;
  btScalar local_7c;
  btScalar local_78 [4];
  btVector3 local_68 [4];
  btVector3 local_28;
  btVector3 local_18;
  
  if ((in_RDI->m_useSolveConstraintObsolete & 1U) != 0) {
    (in_RDI->super_btTypedConstraint).m_appliedImpulse = 0.0;
    in_RDI->m_accMotorImpulse = 0.0;
    if ((in_RDI->m_angularOnly & 1U) == 0) {
      pbVar1 = btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbA);
      btTransform::getOrigin(&in_RDI->m_rbAFrame);
      local_18 = btTransform::operator*(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      pbVar2 = btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbB);
      btTransform::getOrigin(&in_RDI->m_rbBFrame);
      local_28 = btTransform::operator*(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      local_68[3] = operator-(in_stack_fffffffffffffc50,
                              (btVector3 *)
                              CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      local_2c8 = local_68;
      do {
        btVector3::btVector3(local_2c8);
        local_2c8 = local_2c8 + 1;
      } while (local_2c8 != local_68 + 3);
      bVar6 = btVector3::length2((btVector3 *)0x20d93b);
      if (bVar6 <= 1.1920929e-07) {
        local_7c = 1.0;
        local_80 = 0.0;
        local_84 = 0.0;
        btVector3::setValue(local_68,&local_7c,&local_80,&local_84);
      }
      else {
        bVar8 = btVector3::normalized
                          ((btVector3 *)
                           CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        local_78._0_8_ = bVar8.m_floats._0_8_;
        local_68[0].m_floats[0] = local_78[0];
        local_68[0].m_floats[1] = local_78[1];
        local_78._8_8_ = bVar8.m_floats._8_8_;
        local_68[0].m_floats[2] = local_78[2];
        local_68[0].m_floats[3] = local_78[3];
        local_78 = bVar8.m_floats;
      }
      btPlaneSpace1<btVector3>
                (in_stack_fffffffffffffca0->m_el,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90
                );
      for (local_88 = 0.0; (int)local_88 < 3; local_88 = (btScalar)((int)local_88 + 1)) {
        rel_pos2 = in_RDI->m_jac + (int)local_88;
        pbVar3 = btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbA);
        btTransform::getBasis(pbVar3);
        btMatrix3x3::transpose(in_stack_fffffffffffffca0);
        pbVar3 = btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbB);
        btTransform::getBasis(pbVar3);
        btMatrix3x3::transpose(in_stack_fffffffffffffca0);
        btRigidBody::getCenterOfMassPosition((btRigidBody *)0x20da91);
        local_f8 = (btScalar  [4])
                   operator-(in_stack_fffffffffffffc50,
                             (btVector3 *)
                             CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        btRigidBody::getCenterOfMassPosition((btRigidBody *)0x20dac4);
        local_118._16_16_ =
             (undefined1  [16])
             operator-(in_stack_fffffffffffffc50,
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        pbVar9 = local_68 + (int)local_88;
        pbVar4 = (btMatrix3x3 *)
                 btRigidBody::getInvInertiaDiagLocal((in_RDI->super_btTypedConstraint).m_rbA);
        bVar6 = btRigidBody::getInvMass((in_RDI->super_btTypedConstraint).m_rbA);
        in_stack_fffffffffffffc40 =
             (btTransform *)
             btRigidBody::getInvInertiaDiagLocal((in_RDI->super_btTypedConstraint).m_rbB);
        btRigidBody::getInvMass((in_RDI->super_btTypedConstraint).m_rbB);
        btJacobianEntry::btJacobianEntry
                  ((btJacobianEntry *)CONCAT44(bVar6,in_stack_fffffffffffffd10),
                   &in_stack_fffffffffffffc40->m_basis,pbVar4,pbVar9,&rel_pos2->m_linearJointAxis,
                   (btVector3 *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                   (btVector3 *)pbVar1,(btScalar)((ulong)in_stack_fffffffffffffce0 >> 0x20),
                   (btVector3 *)pbVar2,SUB84(in_stack_fffffffffffffce0,0));
      }
    }
    this_00 = (btHingeConstraint *)local_118;
    btVector3::btVector3((btVector3 *)this_00);
    btVector3::btVector3(&local_128);
    pbVar2 = &in_RDI->m_rbAFrame;
    btTransform::getBasis(pbVar2);
    uVar10 = 2;
    local_138 = (btScalar  [4])
                btMatrix3x3::getColumn((btMatrix3x3 *)this_00,in_stack_fffffffffffffc4c);
    btPlaneSpace1<btVector3>
              (in_stack_fffffffffffffca0->m_el,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
    pbVar5 = getRigidBodyA(in_RDI);
    pbVar1 = btRigidBody::getCenterOfMassTransform(pbVar5);
    btTransform::getBasis(pbVar1);
    local_148 = (btScalar  [4])
                ::operator*((btMatrix3x3 *)this_00,
                            (btVector3 *)
                            CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    pbVar5 = getRigidBodyA(in_RDI);
    pbVar1 = btRigidBody::getCenterOfMassTransform(pbVar5);
    btTransform::getBasis(pbVar1);
    local_158 = (btScalar  [4])
                ::operator*((btMatrix3x3 *)this_00,
                            (btVector3 *)
                            CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    pbVar5 = getRigidBodyA(in_RDI);
    pbVar1 = btRigidBody::getCenterOfMassTransform(pbVar5);
    btTransform::getBasis(pbVar1);
    btTransform::getBasis(pbVar2);
    local_178 = (btScalar  [4])
                btMatrix3x3::getColumn((btMatrix3x3 *)this_00,in_stack_fffffffffffffc4c);
    local_168 = (btScalar  [4])
                ::operator*((btMatrix3x3 *)this_00,
                            (btVector3 *)
                            CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    pbVar1 = btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbA);
    btTransform::getBasis(pbVar1);
    btMatrix3x3::transpose(in_stack_fffffffffffffca0);
    pbVar1 = btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbB);
    btTransform::getBasis(pbVar1);
    btMatrix3x3::transpose(in_stack_fffffffffffffca0);
    btRigidBody::getInvInertiaDiagLocal((in_RDI->super_btTypedConstraint).m_rbA);
    btRigidBody::getInvInertiaDiagLocal((in_RDI->super_btTypedConstraint).m_rbB);
    btJacobianEntry::btJacobianEntry
              (in_stack_fffffffffffffce0,(btVector3 *)CONCAT44(uVar10,in_stack_fffffffffffffcd8),
               &pbVar2->m_basis,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               in_stack_fffffffffffffcb8);
    pbVar1 = btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbA);
    btTransform::getBasis(pbVar1);
    btMatrix3x3::transpose(in_stack_fffffffffffffca0);
    pbVar1 = btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbB);
    btTransform::getBasis(pbVar1);
    btMatrix3x3::transpose(in_stack_fffffffffffffca0);
    pbVar4 = (btMatrix3x3 *)
             btRigidBody::getInvInertiaDiagLocal((in_RDI->super_btTypedConstraint).m_rbA);
    btRigidBody::getInvInertiaDiagLocal((in_RDI->super_btTypedConstraint).m_rbB);
    btJacobianEntry::btJacobianEntry
              (in_stack_fffffffffffffce0,(btVector3 *)CONCAT44(uVar10,in_stack_fffffffffffffcd8),
               &pbVar2->m_basis,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               in_stack_fffffffffffffcb8);
    pbVar1 = btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbA);
    btTransform::getBasis(pbVar1);
    btMatrix3x3::transpose(pbVar4);
    pbVar1 = btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbB);
    btTransform::getBasis(pbVar1);
    pbVar9 = local_298;
    btMatrix3x3::transpose(pbVar4);
    inertiaInvA = btRigidBody::getInvInertiaDiagLocal((in_RDI->super_btTypedConstraint).m_rbA);
    btRigidBody::getInvInertiaDiagLocal((in_RDI->super_btTypedConstraint).m_rbB);
    btJacobianEntry::btJacobianEntry
              (in_stack_fffffffffffffce0,(btVector3 *)CONCAT44(uVar10,in_stack_fffffffffffffcd8),
               &pbVar2->m_basis,in_stack_fffffffffffffcc8,inertiaInvA,pbVar9);
    in_RDI->m_accLimitImpulse = 0.0;
    btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbA);
    btRigidBody::getCenterOfMassTransform((in_RDI->super_btTypedConstraint).m_rbB);
    testLimit(this_00,(btTransform *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
              in_stack_fffffffffffffc40);
    pbVar5 = getRigidBodyA(in_RDI);
    pbVar1 = btRigidBody::getCenterOfMassTransform(pbVar5);
    btTransform::getBasis(pbVar1);
    btTransform::getBasis(pbVar2);
    btMatrix3x3::getColumn((btMatrix3x3 *)this_00,in_stack_fffffffffffffc4c);
    ::operator*((btMatrix3x3 *)this_00,
                (btVector3 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    getRigidBodyA(in_RDI);
    bVar6 = btRigidBody::computeAngularImpulseDenominator
                      ((btRigidBody *)this_00,
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    getRigidBodyB(in_RDI);
    bVar7 = btRigidBody::computeAngularImpulseDenominator
                      ((btRigidBody *)this_00,
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    in_RDI->m_kHinge = 1.0 / (bVar6 + bVar7);
  }
  return;
}

Assistant:

void	btHingeConstraint::buildJacobian()
{
	if (m_useSolveConstraintObsolete)
	{
		m_appliedImpulse = btScalar(0.);
		m_accMotorImpulse = btScalar(0.);

		if (!m_angularOnly)
		{
			btVector3 pivotAInW = m_rbA.getCenterOfMassTransform()*m_rbAFrame.getOrigin();
			btVector3 pivotBInW = m_rbB.getCenterOfMassTransform()*m_rbBFrame.getOrigin();
			btVector3 relPos = pivotBInW - pivotAInW;

			btVector3 normal[3];
			if (relPos.length2() > SIMD_EPSILON)
			{
				normal[0] = relPos.normalized();
			}
			else
			{
				normal[0].setValue(btScalar(1.0),0,0);
			}

			btPlaneSpace1(normal[0], normal[1], normal[2]);

			for (int i=0;i<3;i++)
			{
				new (&m_jac[i]) btJacobianEntry(
				m_rbA.getCenterOfMassTransform().getBasis().transpose(),
				m_rbB.getCenterOfMassTransform().getBasis().transpose(),
				pivotAInW - m_rbA.getCenterOfMassPosition(),
				pivotBInW - m_rbB.getCenterOfMassPosition(),
				normal[i],
				m_rbA.getInvInertiaDiagLocal(),
				m_rbA.getInvMass(),
				m_rbB.getInvInertiaDiagLocal(),
				m_rbB.getInvMass());
			}
		}

		//calculate two perpendicular jointAxis, orthogonal to hingeAxis
		//these two jointAxis require equal angular velocities for both bodies

		//this is unused for now, it's a todo
		btVector3 jointAxis0local;
		btVector3 jointAxis1local;
		
		btPlaneSpace1(m_rbAFrame.getBasis().getColumn(2),jointAxis0local,jointAxis1local);

		btVector3 jointAxis0 = getRigidBodyA().getCenterOfMassTransform().getBasis() * jointAxis0local;
		btVector3 jointAxis1 = getRigidBodyA().getCenterOfMassTransform().getBasis() * jointAxis1local;
		btVector3 hingeAxisWorld = getRigidBodyA().getCenterOfMassTransform().getBasis() * m_rbAFrame.getBasis().getColumn(2);
			
		new (&m_jacAng[0])	btJacobianEntry(jointAxis0,
			m_rbA.getCenterOfMassTransform().getBasis().transpose(),
			m_rbB.getCenterOfMassTransform().getBasis().transpose(),
			m_rbA.getInvInertiaDiagLocal(),
			m_rbB.getInvInertiaDiagLocal());

		new (&m_jacAng[1])	btJacobianEntry(jointAxis1,
			m_rbA.getCenterOfMassTransform().getBasis().transpose(),
			m_rbB.getCenterOfMassTransform().getBasis().transpose(),
			m_rbA.getInvInertiaDiagLocal(),
			m_rbB.getInvInertiaDiagLocal());

		new (&m_jacAng[2])	btJacobianEntry(hingeAxisWorld,
			m_rbA.getCenterOfMassTransform().getBasis().transpose(),
			m_rbB.getCenterOfMassTransform().getBasis().transpose(),
			m_rbA.getInvInertiaDiagLocal(),
			m_rbB.getInvInertiaDiagLocal());

			// clear accumulator
			m_accLimitImpulse = btScalar(0.);

			// test angular limit
			testLimit(m_rbA.getCenterOfMassTransform(),m_rbB.getCenterOfMassTransform());

		//Compute K = J*W*J' for hinge axis
		btVector3 axisA =  getRigidBodyA().getCenterOfMassTransform().getBasis() *  m_rbAFrame.getBasis().getColumn(2);
		m_kHinge =   1.0f / (getRigidBodyA().computeAngularImpulseDenominator(axisA) +
							 getRigidBodyB().computeAngularImpulseDenominator(axisA));

	}
}